

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O3

int __thiscall BOCC_CTA::begin_trans(BOCC_CTA *this)

{
  int iVar1;
  Transaction *this_00;
  mapped_type *ppTVar2;
  rep rVar3;
  int id;
  int local_34;
  
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->scheduler_lock);
  if (iVar1 != 0x23) {
    iVar1 = this->counter;
    local_34 = iVar1;
    this_00 = (Transaction *)operator_new(0xc0);
    Transaction::Transaction(this_00,iVar1,this->M);
    ppTVar2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->transactions,&local_34);
    *ppTVar2 = this_00;
    rVar3 = std::chrono::_V2::system_clock::now();
    ppTVar2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->transactions,&local_34);
    ((*ppTVar2)->start_time).__d.__r = rVar3;
    this->counter = this->counter + 1;
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
    return local_34;
  }
  std::__throw_system_error(0x23);
}

Assistant:

int BOCC_CTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    transactions[id]->start_time = std::chrono::high_resolution_clock::now();
    counter++;
    scheduler_lock.unlock();

    return id;
}